

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

bool __thiscall PDA::evaluate(PDA *this,string *s)

{
  initializer_list<EvaluationState> __l;
  bool bVar1;
  reference pcVar2;
  EvaluationState *local_1d8;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_1b8;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_1a0;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_188;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_170;
  char local_151;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_150;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  EvaluationState *local_130;
  EvaluationState local_128;
  undefined1 local_d0 [40];
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_a8;
  undefined1 local_80 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stack;
  vector<EvaluationState,_std::allocator<EvaluationState>_> evaluations;
  string *s_local;
  PDA *this_local;
  
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)
             &stack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_80);
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_80,&this->startStackZ0);
  local_130 = &local_128;
  EvaluationState::EvaluationState
            (local_130,
             (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80,this->startState);
  local_d0._0_8_ = &local_128;
  local_d0._8_8_ = 1;
  std::allocator<EvaluationState>::allocator((allocator<EvaluationState> *)((long)&__range1 + 7));
  __l._M_len = local_d0._8_8_;
  __l._M_array = (iterator)local_d0._0_8_;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_d0 + 0x10),__l,
             (allocator<EvaluationState> *)((long)&__range1 + 7));
  eclose(&local_a8,this,
         (vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_d0 + 0x10));
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::operator=
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)
             &stack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_a8);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_a8);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_d0 + 0x10));
  std::allocator<EvaluationState>::~allocator((allocator<EvaluationState> *)((long)&__range1 + 7));
  local_1d8 = (EvaluationState *)local_d0;
  do {
    local_1d8 = local_1d8 + -1;
    EvaluationState::~EvaluationState(local_1d8);
  } while (local_1d8 != &local_128);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_150._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffeb0);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_151 = *pcVar2;
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
              (&local_1a0,
               (vector<EvaluationState,_std::allocator<EvaluationState>_> *)
               &stack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
    nextEvaluations(&local_188,this,&local_1a0,local_151);
    eclose(&local_170,this,&local_188);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::operator=
              ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)
               &stack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_170);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_170);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_188);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_1a0);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            (&local_1b8,
             (vector<EvaluationState,_std::allocator<EvaluationState>_> *)
             &stack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  bVar1 = containsEndState(this,&local_1b8);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_1b8);
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_80);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)
             &stack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return bVar1;
}

Assistant:

bool PDA::evaluate(std::string s) {

    std::vector<EvaluationState> evaluations;

    std::stack<std::string> stack;
    stack.push(startStackZ0);

    evaluations = eclose({EvaluationState(stack, startState)});

    for (char c: s) {
        evaluations = eclose(nextEvaluations(evaluations, c));
    }

    return containsEndState(evaluations);
}